

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_file_writer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  undefined1 *__src;
  size_type __n;
  Writer *pWVar1;
  char cVar2;
  size_t sVar3;
  istream *piVar4;
  string current_line;
  vector<char,_std::allocator<char>_> result;
  shared_ptr<diffusion::Writer> file_writer;
  string dfsn_file;
  ifstream input_text_file;
  allocator_type local_2a1;
  undefined1 *local_2a0;
  size_type local_298;
  undefined1 local_290;
  undefined7 uStack_28f;
  vector<char,_std::allocator<char>_> local_280;
  Writer *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  string local_258;
  long local_238 [65];
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107178);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," diffusion_file input_text_file",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  else {
    std::ifstream::ifstream((istream *)local_238,argv[2],_S_in);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,argv[1],(allocator<char> *)&local_2a0);
    local_268 = diffusion::create_file_writer(&local_258);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<diffusion::Writer*>
              (&local_260,local_268);
    local_2a0 = &local_290;
    local_298 = 0;
    local_290 = 0;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2a0,cVar2);
      pWVar1 = local_268;
      __n = local_298;
      __src = local_2a0;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<char,_std::allocator<char>_>::vector(&local_280,local_298,&local_2a1);
      if (__n != 0) {
        memmove(local_280.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,__src,__n);
      }
      (**pWVar1->_vptr_Writer)(pWVar1,&local_280);
      if (local_280.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_280.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_280.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_280.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
    }
    if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::~ifstream(local_238);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 3) {
        std::cerr << "Usage: " << argv[0] << " diffusion_file input_text_file" << std::endl;
        return 0;
    }
    std::ifstream input_text_file(argv[2]);
    std::string dfsn_file = argv[1];
    auto file_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_file_writer(dfsn_file));
    std::string current_line;
    while (std::getline(input_text_file, current_line)) {
        file_writer->write(diffusion::to_vector_char(current_line.c_str(), current_line.length()));
    }
    return 0;
}